

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O3

uint32_t absl::lts_20250127::hash_internal::CityHash32(char *s,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar5 = (uint)len;
  if (0x18 < len) {
    uVar3 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar5;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0x10)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x10)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar6 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar5 * -0x3361d2af;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64 ^
            (*(int *)(s + (len - 0xc)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0xc)) * -0x3361d2af) >> 0x11) * 0x1b873593;
    uVar6 = (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
            uVar5 * -0x3361d2af;
    uVar5 = (uVar5 * 0x2000 | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar9 = (len - 1) / 0x14;
    do {
      uVar4 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593;
      uVar6 = (*(int *)((long)s + 8) * 0x16a88000 |
              (uint)(*(int *)((long)s + 8) * -0x3361d2af) >> 0x11) * 0x1b873593 + uVar6;
      uVar3 = uVar3 ^ uVar4;
      uVar10 = uVar5 + *(int *)((long)s + 4);
      uVar3 = (*(int *)((long)s + 0xc) * 0x16a88000 |
              (uint)(*(int *)((long)s + 0xc) * -0x3361d2af) >> 0x11) * 0x1b873593 +
              *(int *)((long)s + 4) ^ (uVar3 << 0xe | uVar3 >> 0x12) * 5 + 0xe6546b64;
      uVar5 = (uVar6 * 0x4000 | uVar6 >> 0x12) * 5 + 0xe6546b64 ^ *(uint *)((long)s + 0x10);
      uVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8;
      uVar5 = (uVar1 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) * 5;
      uVar3 = ((uVar3 << 0xd | uVar3 >> 0x13) + *(uint *)((long)s + 0x10)) * 5 + 0xe6546b64;
      uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8;
      uVar6 = uVar2 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
      uVar3 = (uVar10 * 0x2000 | uVar10 >> 0x13) * -0x3361d2af + uVar4;
      s = (char *)((long)s + 0x14);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    uVar3 = ((uVar6 >> 0xb) * 0x16a88000 | (uVar2 << 0x15 | uVar6 >> 0xb) * -0x3361d2af >> 0x11) *
            -0x3361d2af + uVar3;
    uVar3 = (uVar3 * 0x2000 | uVar3 >> 0x13) * 5 + 0xe6546b64;
    iVar7 = (uVar3 * 0x8000 | uVar3 >> 0x11) +
            ((uVar5 >> 0xb) * 0x16a88000 | (uVar1 * 0xa00000 | uVar5 >> 0xb) * -0x3361d2af >> 0x11);
    uVar5 = (iVar7 * -0x3a55e000 | (uint)(iVar7 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar5 * 0x8000 | uVar5 >> 0x11) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (4 < len) {
      iVar7 = *(int *)(s + (len - 4)) + uVar5 * 5;
      uVar3 = ((*(int *)s + uVar5) * 0x16a88000 | (*(int *)s + uVar5) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar5 * 5;
      uVar3 = (iVar7 * 0x16a88000 | (uint)(iVar7 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64;
      uVar5 = ((*(int *)(s + (uVar5 >> 1 & 4)) + 9) * 0x16a88000 |
              (uint)((*(int *)(s + (uVar5 >> 1 & 4)) + 9) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64;
      uVar5 = (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
      uVar5 = uVar5 >> 0x10 ^ uVar5;
      goto LAB_0033ebfd;
    }
    if (len == 0) {
      uVar3 = 0;
      uVar6 = 9;
    }
    else {
      uVar6 = 9;
      uVar3 = 0;
      sVar8 = 0;
      do {
        uVar3 = uVar3 * -0x3361d2af + (int)s[sVar8];
        uVar6 = uVar6 ^ uVar3;
        sVar8 = sVar8 + 1;
      } while (len != sVar8);
    }
    uVar6 = (uVar5 * 0x16a88000 | uVar5 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar6;
    uVar5 = (uVar3 * 0x16a88000 | uVar3 * -0x3361d2af >> 0x11) * 0x1b873593 ^
            (uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = uVar5 << 0xd | uVar5 >> 0x13;
  }
  else {
    uVar5 = (*(int *)(s + ((len >> 1) - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + ((len >> 1) - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ uVar5;
    uVar5 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 8)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 8)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len >> 1)) * 0x16a88000 |
            (uint)(*(int *)(s + (len >> 1)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (*(int *)(s + (len - 4)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 4)) * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = uVar5 << 0xd | uVar5 >> 0x13;
  }
  uVar5 = uVar5 * 5 + 0xe6546b64;
  uVar5 = uVar5 >> 0x10 ^ uVar5;
LAB_0033ebfd:
  uVar5 = (uVar5 * -0x7a143595 >> 0xd ^ uVar5 * -0x7a143595) * -0x3d4d51cb;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

uint32_t CityHash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12
               ? (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len))
               : Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = static_cast<uint32_t>(len), g = c1 * h, f = g;

  uint32_t a0 = Rotate32(Fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate32(Fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate32(Fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate32(Fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate32(Fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t b0 = Rotate32(Fetch32(s) * c1, 17) * c2;
    uint32_t b1 = Fetch32(s + 4);
    uint32_t b2 = Rotate32(Fetch32(s + 8) * c1, 17) * c2;
    uint32_t b3 = Rotate32(Fetch32(s + 12) * c1, 17) * c2;
    uint32_t b4 = Fetch32(s + 16);
    h ^= b0;
    h = Rotate32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += b1;
    f = Rotate32(f, 19);
    f = f * c1;
    g += b2;
    g = Rotate32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= b3 + b1;
    h = Rotate32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= b4;
    g = absl::gbswap_32(g) * 5;
    h += b4 * 5;
    h = absl::gbswap_32(h);
    f += b0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate32(g, 11) * c1;
  g = Rotate32(g, 17) * c1;
  f = Rotate32(f, 11) * c1;
  f = Rotate32(f, 17) * c1;
  h = Rotate32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  h = Rotate32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  return h;
}